

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

int __thiscall Imf_3_4::DeepTiledInputFile::numXTiles(DeepTiledInputFile *this,int lx)

{
  int iVar1;
  exr_context_t p_Var2;
  element_type *peVar3;
  ostream *poVar4;
  char *pcVar5;
  ArgExc *this_00;
  undefined4 in_ESI;
  stringstream _iex_throw_s;
  int32_t countx;
  stringstream local_198 [16];
  ostream local_188 [376];
  int local_10;
  undefined4 local_c;
  
  local_10 = 0;
  local_c = in_ESI;
  p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1b94f3);
  peVar3 = std::
           __shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b9506);
  iVar1 = exr_get_tile_counts(p_Var2,peVar3->partNumber,local_c,0,&local_10,0);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    poVar4 = std::operator<<(local_188,"Error calling numXTiles() on image file \"");
    pcVar5 = fileName((DeepTiledInputFile *)0x1b9568);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_198);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return local_10;
}

Assistant:

int
DeepTiledInputFile::numXTiles (int lx) const
{
    int32_t countx = 0;
    if (EXR_ERR_SUCCESS != exr_get_tile_counts (
            _ctxt, _data->partNumber, lx, 0, &countx, nullptr))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error calling numXTiles() on image "
            "file \""
                << fileName () << "\".");
    }
    return countx;
}